

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O1

bool __thiscall
ArgsManager::ReadConfigStream
          (ArgsManager *this,istream *stream,string *filepath,string *error,bool ignore_invalid_keys
          )

{
  list<SectionInfo,_std::allocator<SectionInfo>_> *__position;
  undefined1 *puVar1;
  long lVar2;
  string key;
  long lVar3;
  char *pcVar4;
  char *__n;
  char cVar5;
  bool bVar6;
  int iVar7;
  istream *piVar8;
  void *pvVar9;
  size_type sVar10;
  ulong uVar11;
  pointer pcVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  optional<unsigned_int> oVar14;
  mapped_type *this_00;
  mapped_type *this_01;
  undefined8 uVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  char *pcVar17;
  size_type sVar18;
  pointer args;
  pointer pcVar19;
  undefined8 uVar20;
  undefined4 uVar21;
  undefined7 in_register_00000081;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  size_type sVar22;
  char *__data;
  pointer pcVar23;
  size_type __size;
  pointer pcVar24;
  _Alloc_hider _Var25;
  long in_FS_OFFSET;
  bool bVar26;
  string_view logging_function;
  string_view source_file;
  pointer ppVar27;
  uint uVar28;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
  *this_02;
  undefined4 in_stack_fffffffffffffe50;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  options;
  int local_164;
  string_view value;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  optional<UniValue> value_1;
  long *local_e0 [2];
  long local_d0 [2];
  string str;
  key_type local_a0;
  string name;
  string prefix;
  
  args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           CONCAT71(in_register_00000081,ignore_invalid_keys);
  uVar21 = SUB84(args_1,0);
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  criticalblock2.super_unique_lock._M_owns = false;
  criticalblock2.super_unique_lock._M_device = (mutex_type *)this;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock2.super_unique_lock);
  options.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  options.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  options.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __position = &this->m_config_sections;
  str._M_dataplus._M_p = (pointer)&str.field_2;
  str._M_string_length = 0;
  str.field_2._M_local_buf[0] = '\0';
  prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
  prefix._M_string_length = 0;
  prefix.field_2._M_local_buf[0] = '\0';
  local_164 = 1;
  while( true ) {
    cVar5 = std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + (char)stream);
    piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (stream,(string *)&str,cVar5);
    _Var25 = str._M_dataplus;
    pcVar17 = *(char **)(*(long *)piVar8 + -0x18);
    uVar28 = *(uint *)(piVar8 + 0x20 + (long)pcVar17);
    if ((uVar28 & 5) != 0) break;
    if (str._M_string_length == 0) {
      sVar22 = 0xffffffffffffffff;
    }
    else {
      pvVar9 = memchr(str._M_dataplus._M_p,0x23,str._M_string_length);
      sVar22 = -(ulong)(pvVar9 == (void *)0x0) | (long)pvVar9 - (long)_Var25._M_p;
    }
    if (sVar22 != 0xffffffffffffffff) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_1,&str,
                 0,sVar22);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&str,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_1)
      ;
      if ((undefined1 *)
          value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
          super__Optional_payload<UniValue,_true,_false,_false>.
          super__Optional_payload_base<UniValue>._M_payload._0_8_ !=
          (undefined1 *)
          ((long)&value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                  super__Optional_payload<UniValue,_true,_false,_false>.
                  super__Optional_payload_base<UniValue>._M_payload + 0x10)) {
        operator_delete((void *)value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                                super__Optional_payload<UniValue,_true,_false,_false>.
                                super__Optional_payload_base<UniValue>._M_payload._0_8_,
                        value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                        super__Optional_payload<UniValue,_true,_false,_false>.
                        super__Optional_payload_base<UniValue>._M_payload._M_value.val.
                        _M_string_length + 1);
      }
    }
    if (GetConfigOptions(std::istream&,std::__cxx11::string_const&,std::__cxx11::string&,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>&,std::__cxx11::list<SectionInfo,std::allocator<SectionInfo>>&)
        ::pattern_abi_cxx11_ == '\0') {
      ReadConfigStream();
    }
    sVar18 = str._M_string_length;
    _Var25._M_p = str._M_dataplus._M_p;
    uVar15 = DAT_006c84a0;
    pcVar17 = GetConfigOptions(std::istream&,std::__cxx11::string_const&,std::__cxx11::string&,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>&,std::__cxx11::list<SectionInfo,std::allocator<SectionInfo>>&)
              ::pattern_abi_cxx11_;
    name._M_dataplus._M_p = (pointer)str._M_string_length;
    name._M_string_length = (size_type)str._M_dataplus._M_p;
    pcVar19 = (pointer)0xffffffffffffffff;
    if (str._M_string_length != 0) {
      if (DAT_006c84a0 == (char *)0x0) {
        pcVar19 = (pointer)0x0;
      }
      else {
        pcVar23 = (pointer)0x0;
        do {
          pvVar9 = memchr(pcVar17,(int)_Var25._M_p[(long)pcVar23],uVar15);
          pcVar19 = pcVar23;
          if (pvVar9 == (void *)0x0) break;
          pcVar23 = pcVar23 + 1;
          pcVar19 = (pointer)0xffffffffffffffff;
        } while ((pointer)sVar18 != pcVar23);
      }
    }
    if (pcVar19 != (pointer)0xffffffffffffffff) {
      sVar10 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                         ((basic_string_view<char,_std::char_traits<char>_> *)&name,pcVar17,
                          0xffffffffffffffff,uVar15);
      if (pcVar19 <= name._M_dataplus._M_p) {
        uVar11 = (sVar10 - (long)pcVar19) + 1;
        if ((ulong)((long)name._M_dataplus._M_p - (long)pcVar19) < uVar11) {
          uVar11 = (long)name._M_dataplus._M_p - (long)pcVar19;
        }
        pcVar19 = pcVar19 + name._M_string_length;
        goto LAB_003eda5f;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   pcVar19);
        goto LAB_003ee5b3;
      }
      goto LAB_003ee873;
    }
    uVar11 = 0;
    pcVar19 = (pointer)0x0;
LAB_003eda5f:
    puVar1 = (undefined1 *)
             ((long)&value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                     super__Optional_payload<UniValue,_true,_false,_false>.
                     super__Optional_payload_base<UniValue>._M_payload + 0x10);
    value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
    super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
    _M_payload._0_8_ = puVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&value_1,pcVar19,pcVar19 + uVar11);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&str,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_1);
    if ((undefined1 *)
        value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
        super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>
        ._M_payload._0_8_ != puVar1) {
      operator_delete((void *)value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                              super__Optional_payload<UniValue,_true,_false,_false>.
                              super__Optional_payload_base<UniValue>._M_payload._0_8_,
                      value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                      super__Optional_payload<UniValue,_true,_false,_false>.
                      super__Optional_payload_base<UniValue>._M_payload._M_value.val.
                      _M_string_length + 1);
    }
    pcVar23 = (pointer)str._M_string_length;
    _Var25._M_p = str._M_dataplus._M_p;
    if (str._M_string_length != 0) {
      if (*str._M_dataplus._M_p != '[') {
        if (*str._M_dataplus._M_p != '-') goto LAB_003edae9;
        pcVar17 = (char *)&str;
        tinyformat::format<int,std::__cxx11::string>
                  ((string *)&value_1,
                   (tinyformat *)
                   "parse error on line %i: %s, options in configuration file must be specified without leading -"
                   ,(char *)&local_164,(int *)pcVar17,args_1);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (error,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &value_1);
        uVar15 = value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                 super__Optional_payload<UniValue,_true,_false,_false>.
                 super__Optional_payload_base<UniValue>._M_payload._M_value.val._M_string_length;
        uVar20 = value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                 super__Optional_payload<UniValue,_true,_false,_false>.
                 super__Optional_payload_base<UniValue>._M_payload._0_8_;
        if ((undefined1 *)
            value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
            super__Optional_payload<UniValue,_true,_false,_false>.
            super__Optional_payload_base<UniValue>._M_payload._0_8_ !=
            (undefined1 *)
            ((long)&value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                    super__Optional_payload<UniValue,_true,_false,_false>.
                    super__Optional_payload_base<UniValue>._M_payload + 0x10)) {
LAB_003ee242:
          operator_delete((void *)uVar20,uVar15 + 1);
        }
        break;
      }
      if (str._M_dataplus._M_p[str._M_string_length - 1] == ']') {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&name,&str,1,str._M_string_length - 2);
        value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
        super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>
        ._M_payload._0_8_ = puVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&value_1,name._M_dataplus._M_p,
                   name._M_dataplus._M_p + name._M_string_length);
        value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
        super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>
        ._M_payload._32_8_ =
             (long)&value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                    super__Optional_payload<UniValue,_true,_false,_false>.
                    super__Optional_payload_base<UniValue>._M_payload + 0x30;
        pcVar19 = (filepath->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)
                   ((long)&value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                           super__Optional_payload<UniValue,_true,_false,_false>.
                           super__Optional_payload_base<UniValue>._M_payload + 0x20),pcVar19,
                   pcVar19 + filepath->_M_string_length);
        value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
        super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>
        ._M_payload._64_4_ = local_164;
        std::__cxx11::list<SectionInfo,_std::allocator<SectionInfo>_>::_M_insert<SectionInfo>
                  (__position,(iterator)__position,(SectionInfo *)&value_1);
        if ((undefined1 *)
            value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
            super__Optional_payload<UniValue,_true,_false,_false>.
            super__Optional_payload_base<UniValue>._M_payload._32_8_ !=
            (undefined1 *)
            ((long)&value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                    super__Optional_payload<UniValue,_true,_false,_false>.
                    super__Optional_payload_base<UniValue>._M_payload + 0x30)) {
          operator_delete((void *)value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                                  super__Optional_payload<UniValue,_true,_false,_false>.
                                  super__Optional_payload_base<UniValue>._M_payload._32_8_,
                          (ulong)((long)&((value_1.super__Optional_base<UniValue,_false,_false>.
                                           _M_payload.
                                           super__Optional_payload<UniValue,_true,_false,_false>.
                                           super__Optional_payload_base<UniValue>._M_payload.
                                           _M_value.keys.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)
                                         ._M_p + 1));
        }
        if ((undefined1 *)
            value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
            super__Optional_payload<UniValue,_true,_false,_false>.
            super__Optional_payload_base<UniValue>._M_payload._0_8_ != puVar1) {
          operator_delete((void *)value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                                  super__Optional_payload<UniValue,_true,_false,_false>.
                                  super__Optional_payload_base<UniValue>._M_payload._0_8_,
                          value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                          super__Optional_payload<UniValue,_true,_false,_false>.
                          super__Optional_payload_base<UniValue>._M_payload._M_value.val.
                          _M_string_length + 1);
        }
        value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
        super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>
        ._M_payload._0_8_ = puVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&value_1,name._M_dataplus._M_p,
                   name._M_dataplus._M_p + name._M_string_length);
        args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2e;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_replace_aux((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_1
                       ,(size_type)
                        value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                        super__Optional_payload<UniValue,_true,_false,_false>.
                        super__Optional_payload_base<UniValue>._M_payload._M_value.val._M_dataplus.
                        _M_p,0,1,'.');
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&prefix,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &value_1);
        if ((undefined1 *)
            value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
            super__Optional_payload<UniValue,_true,_false,_false>.
            super__Optional_payload_base<UniValue>._M_payload._0_8_ != puVar1) {
          operator_delete((void *)value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                                  super__Optional_payload<UniValue,_true,_false,_false>.
                                  super__Optional_payload_base<UniValue>._M_payload._0_8_,
                          value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                          super__Optional_payload<UniValue,_true,_false,_false>.
                          super__Optional_payload_base<UniValue>._M_payload._M_value.val.
                          _M_string_length + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)name._M_dataplus._M_p != &name.field_2) {
          operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
        }
        goto LAB_003ede9a;
      }
LAB_003edae9:
      pcVar12 = (pointer)memchr(str._M_dataplus._M_p,0x3d,str._M_string_length);
      pcVar17 = DAT_006c84a0;
      pcVar4 = GetConfigOptions(std::istream&,std::__cxx11::string_const&,std::__cxx11::string&,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>&,std::__cxx11::list<SectionInfo,std::allocator<SectionInfo>>&)
               ::pattern_abi_cxx11_;
      if ((pcVar12 != (pointer)0x0) &&
         (pcVar24 = pcVar12 + -(long)_Var25._M_p, pcVar24 != (pointer)0xffffffffffffffff)) {
        if (pcVar24 <= pcVar23) {
          pcVar23 = pcVar24;
        }
        value._M_str = _Var25._M_p;
        pcVar19 = (pointer)0xffffffffffffffff;
        value._M_len = (size_t)pcVar23;
        if ((pcVar12 != _Var25._M_p) && (pcVar19 = (pointer)0x0, DAT_006c84a0 != (char *)0x0)) {
          do {
            pvVar9 = memchr(pcVar4,(int)_Var25._M_p[(long)pcVar19],(size_t)pcVar17);
            if (pvVar9 == (void *)0x0) goto LAB_003edb69;
            pcVar19 = pcVar19 + 1;
          } while (pcVar23 != pcVar19);
          pcVar19 = (pointer)0xffffffffffffffff;
        }
LAB_003edb69:
        if (pcVar19 == (pointer)0xffffffffffffffff) {
          uVar11 = 0;
          pcVar19 = (pointer)0x0;
LAB_003edbb7:
          pcVar17 = (char *)((long)&value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                                    super__Optional_payload<UniValue,_true,_false,_false>.
                                    super__Optional_payload_base<UniValue>._M_payload + 0x10);
          value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
          super__Optional_payload<UniValue,_true,_false,_false>.
          super__Optional_payload_base<UniValue>._M_payload._0_8_ = pcVar17;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&value_1,pcVar19,pcVar19 + uVar11);
          args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   prefix._M_string_length;
          pbVar13 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &value_1,0,0,prefix._M_dataplus._M_p,prefix._M_string_length);
          name._M_dataplus._M_p = (pbVar13->_M_dataplus)._M_p;
          paVar16 = &pbVar13->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)name._M_dataplus._M_p == paVar16) {
            name.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
            name.field_2._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
            name._M_dataplus._M_p = (pointer)&name.field_2;
          }
          else {
            name.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
          }
          name._M_string_length = pbVar13->_M_string_length;
          (pbVar13->_M_dataplus)._M_p = (pointer)paVar16;
          pbVar13->_M_string_length = 0;
          (pbVar13->field_2)._M_local_buf[0] = '\0';
          if ((char *)value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                      super__Optional_payload<UniValue,_true,_false,_false>.
                      super__Optional_payload_base<UniValue>._M_payload._0_8_ != pcVar17) {
            operator_delete((void *)value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                                    super__Optional_payload<UniValue,_true,_false,_false>.
                                    super__Optional_payload_base<UniValue>._M_payload._0_8_,
                            value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                            super__Optional_payload<UniValue,_true,_false,_false>.
                            super__Optional_payload_base<UniValue>._M_payload._M_value.val.
                            _M_string_length + 1);
          }
          __n = DAT_006c84a0;
          pcVar4 = GetConfigOptions(std::istream&,std::__cxx11::string_const&,std::__cxx11::string&,std::vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>&,std::__cxx11::list<SectionInfo,std::allocator<SectionInfo>>&)
                   ::pattern_abi_cxx11_;
          pcVar19 = pcVar24 + 1;
          uVar15 = str._M_string_length;
          if (pcVar24 < str._M_string_length) {
            _Var25._M_p = str._M_dataplus._M_p + pcVar19;
            pcVar23 = (pointer)(str._M_string_length - (long)pcVar19);
            pcVar19 = (pointer)0xffffffffffffffff;
            value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
            super__Optional_payload<UniValue,_true,_false,_false>.
            super__Optional_payload_base<UniValue>._M_payload._0_8_ = pcVar23;
            value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
            super__Optional_payload<UniValue,_true,_false,_false>.
            super__Optional_payload_base<UniValue>._M_payload._M_value.val._M_dataplus._M_p =
                 (_Alloc_hider)_Var25._M_p;
            if (pcVar23 != (pointer)0x0) {
              if (DAT_006c84a0 == (char *)0x0) {
                pcVar19 = (pointer)0x0;
              }
              else {
                pcVar12 = (pointer)0x0;
                do {
                  pvVar9 = memchr(pcVar4,(int)_Var25._M_p[(long)pcVar12],(size_t)__n);
                  pcVar19 = pcVar12;
                  if (pvVar9 == (void *)0x0) break;
                  pcVar12 = pcVar12 + 1;
                  pcVar19 = (pointer)0xffffffffffffffff;
                } while (pcVar23 != pcVar12);
              }
            }
            if (pcVar19 == (pointer)0xffffffffffffffff) {
              value._M_len = 0;
              value._M_str = (char *)0x0;
            }
            else {
              sVar10 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                                 ((basic_string_view<char,_std::char_traits<char>_> *)&value_1,
                                  pcVar4,0xffffffffffffffff,(size_type)__n);
              pcVar17 = __n;
              uVar15 = value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                       super__Optional_payload<UniValue,_true,_false,_false>.
                       super__Optional_payload_base<UniValue>._M_payload._0_8_;
              if ((ulong)value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                         super__Optional_payload<UniValue,_true,_false,_false>.
                         super__Optional_payload_base<UniValue>._M_payload._0_8_ < pcVar19)
              goto LAB_003ee5b3;
              value._M_len = (sVar10 - (long)pcVar19) + 1;
              if ((ulong)(value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                          super__Optional_payload<UniValue,_true,_false,_false>.
                          super__Optional_payload_base<UniValue>._M_payload._0_8_ - (long)pcVar19) <
                  value._M_len) {
                value._M_len = value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                               super__Optional_payload<UniValue,_true,_false,_false>.
                               super__Optional_payload_base<UniValue>._M_payload._0_8_ -
                               (long)pcVar19;
              }
              value._M_str = pcVar19 + (long)value_1.super__Optional_base<UniValue,_false,_false>.
                                             _M_payload.
                                             super__Optional_payload<UniValue,_true,_false,_false>.
                                             super__Optional_payload_base<UniValue>._M_payload.
                                             _M_value.val._M_dataplus._M_p;
            }
            if (sVar22 != 0xffffffffffffffff) {
              pcVar17 = (char *)0xb;
              sVar22 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                                 (&name,"rpcpassword",0,0xb);
              if (sVar22 != 0xffffffffffffffff) {
                tinyformat::format<int>
                          ((string *)&value_1,
                           "parse error on line %i, using # in rpcpassword can be ambiguous and should be avoided"
                           ,&local_164);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=(error,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&value_1);
                if ((undefined1 *)
                    value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                    super__Optional_payload<UniValue,_true,_false,_false>.
                    super__Optional_payload_base<UniValue>._M_payload._0_8_ !=
                    (undefined1 *)
                    ((long)&value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                            super__Optional_payload<UniValue,_true,_false,_false>.
                            super__Optional_payload_base<UniValue>._M_payload + 0x10)) {
                  operator_delete((void *)value_1.super__Optional_base<UniValue,_false,_false>.
                                          _M_payload.
                                          super__Optional_payload<UniValue,_true,_false,_false>.
                                          super__Optional_payload_base<UniValue>._M_payload._0_8_,
                                  value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                                  super__Optional_payload<UniValue,_true,_false,_false>.
                                  super__Optional_payload_base<UniValue>._M_payload._M_value.val.
                                  _M_string_length + 1);
                }
                uVar15 = name.field_2._M_allocated_capacity;
                uVar20 = name._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)name._M_dataplus._M_p != &name.field_2) goto LAB_003ee242;
                break;
              }
            }
            std::
            vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
            ::
            emplace_back<std::__cxx11::string&,std::basic_string_view<char,std::char_traits<char>>&>
                      ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                        *)&options,&name,&value);
            sVar22 = name._M_string_length;
            if (name._M_string_length == 0) {
LAB_003eddc0:
              sVar18 = 0xffffffffffffffff;
            }
            else {
              do {
                sVar18 = sVar22 - 1;
                if (sVar22 == 0) goto LAB_003eddc0;
                lVar3 = sVar22 - 1;
                sVar22 = sVar18;
              } while (name._M_dataplus._M_p[lVar3] != '.');
            }
            if ((sVar18 != 0xffffffffffffffff) && (prefix._M_string_length <= sVar18)) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_1,
                     &name,0,sVar18);
              value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
              super__Optional_payload<UniValue,_true,_false,_false>.
              super__Optional_payload_base<UniValue>._M_payload._32_8_ =
                   (long)&value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                          super__Optional_payload<UniValue,_true,_false,_false>.
                          super__Optional_payload_base<UniValue>._M_payload + 0x30;
              pcVar19 = (filepath->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)
                         ((long)&value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                                 super__Optional_payload<UniValue,_true,_false,_false>.
                                 super__Optional_payload_base<UniValue>._M_payload + 0x20),pcVar19,
                         pcVar19 + filepath->_M_string_length);
              value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
              super__Optional_payload<UniValue,_true,_false,_false>.
              super__Optional_payload_base<UniValue>._M_payload._64_4_ = local_164;
              std::__cxx11::list<SectionInfo,_std::allocator<SectionInfo>_>::_M_insert<SectionInfo>
                        (__position,(iterator)__position,(SectionInfo *)&value_1);
              if ((undefined1 *)
                  value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                  super__Optional_payload<UniValue,_true,_false,_false>.
                  super__Optional_payload_base<UniValue>._M_payload._32_8_ !=
                  (undefined1 *)
                  ((long)&value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                          super__Optional_payload<UniValue,_true,_false,_false>.
                          super__Optional_payload_base<UniValue>._M_payload + 0x30)) {
                operator_delete((void *)value_1.super__Optional_base<UniValue,_false,_false>.
                                        _M_payload.
                                        super__Optional_payload<UniValue,_true,_false,_false>.
                                        super__Optional_payload_base<UniValue>._M_payload._32_8_,
                                (ulong)((long)&((value_1.
                                                 super__Optional_base<UniValue,_false,_false>.
                                                 _M_payload.
                                                 super__Optional_payload<UniValue,_true,_false,_false>
                                                 .super__Optional_payload_base<UniValue>._M_payload.
                                                 _M_value.keys.
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish)->
                                               _M_dataplus)._M_p + 1));
              }
              if ((undefined1 *)
                  value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                  super__Optional_payload<UniValue,_true,_false,_false>.
                  super__Optional_payload_base<UniValue>._M_payload._0_8_ !=
                  (undefined1 *)
                  ((long)&value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                          super__Optional_payload<UniValue,_true,_false,_false>.
                          super__Optional_payload_base<UniValue>._M_payload + 0x10)) {
                operator_delete((void *)value_1.super__Optional_base<UniValue,_false,_false>.
                                        _M_payload.
                                        super__Optional_payload<UniValue,_true,_false,_false>.
                                        super__Optional_payload_base<UniValue>._M_payload._0_8_,
                                value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                                super__Optional_payload<UniValue,_true,_false,_false>.
                                super__Optional_payload_base<UniValue>._M_payload._M_value.val.
                                _M_string_length + 1);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)name._M_dataplus._M_p != &name.field_2) {
              operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
            }
            goto LAB_003ede9a;
          }
LAB_003ee5b3:
          if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) goto LAB_003ee873;
          std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                     pcVar19,uVar15);
        }
        else {
          sVar10 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                             (&value,pcVar4,0xffffffffffffffff,(size_type)pcVar17);
          if (pcVar19 <= value._M_len) {
            uVar11 = (sVar10 - (long)pcVar19) + 1;
            if (value._M_len - (long)pcVar19 < uVar11) {
              uVar11 = value._M_len - (long)pcVar19;
            }
            pcVar19 = pcVar19 + (long)value._M_str;
            goto LAB_003edbb7;
          }
        }
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
          uVar15 = std::__throw_out_of_range_fmt
                             ("%s: __pos (which is %zu) > __size (which is %zu)",
                              "basic_string_view::substr",pcVar19);
          if ((char *)value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                      super__Optional_payload<UniValue,_true,_false,_false>.
                      super__Optional_payload_base<UniValue>._M_payload._0_8_ != pcVar17) {
            operator_delete((void *)value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                                    super__Optional_payload<UniValue,_true,_false,_false>.
                                    super__Optional_payload_base<UniValue>._M_payload._0_8_,
                            value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                            super__Optional_payload<UniValue,_true,_false,_false>.
                            super__Optional_payload_base<UniValue>._M_payload._M_value.val.
                            _M_string_length + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)prefix._M_dataplus._M_p != &prefix.field_2) {
            operator_delete(prefix._M_dataplus._M_p,
                            CONCAT71(prefix.field_2._M_allocated_capacity._1_7_,
                                     prefix.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)str._M_dataplus._M_p != &str.field_2) {
            operator_delete(str._M_dataplus._M_p,
                            CONCAT71(str.field_2._M_allocated_capacity._1_7_,
                                     str.field_2._M_local_buf[0]) + 1);
          }
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector(&options);
          std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock2.super_unique_lock);
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
            _Unwind_Resume(uVar15);
          }
        }
        goto LAB_003ee873;
      }
      pcVar17 = (char *)&str;
      tinyformat::format<int,std::__cxx11::string>
                ((string *)&value_1,(tinyformat *)"parse error on line %i: %s",(char *)&local_164,
                 (int *)pcVar17,args_1);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (error,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_1
                );
      if ((undefined1 *)
          value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
          super__Optional_payload<UniValue,_true,_false,_false>.
          super__Optional_payload_base<UniValue>._M_payload._0_8_ !=
          (undefined1 *)
          ((long)&value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                  super__Optional_payload<UniValue,_true,_false,_false>.
                  super__Optional_payload_base<UniValue>._M_payload + 0x10)) {
        operator_delete((void *)value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                                super__Optional_payload<UniValue,_true,_false,_false>.
                                super__Optional_payload_base<UniValue>._M_payload._0_8_,
                        value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                        super__Optional_payload<UniValue,_true,_false,_false>.
                        super__Optional_payload_base<UniValue>._M_payload._M_value.val.
                        _M_string_length + 1);
      }
      sVar22 = str._M_string_length;
      if (str._M_string_length < 2) {
        bVar26 = false;
      }
      else {
        pcVar17 = (char *)0x2;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&name,&str,0,2);
        iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&name,"no");
        bVar26 = iVar7 == 0;
      }
      if ((1 < sVar22) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2)) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      if (bVar26) {
        tinyformat::format<std::__cxx11::string>
                  ((string *)&value_1,
                   (tinyformat *)", if you intended to specify a negated option, use %s=1 instead",
                   (char *)&str,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar17);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (error,(char *)value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                                 super__Optional_payload<UniValue,_true,_false,_false>.
                                 super__Optional_payload_base<UniValue>._M_payload._0_8_,
                   (size_type)
                   value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                   super__Optional_payload<UniValue,_true,_false,_false>.
                   super__Optional_payload_base<UniValue>._M_payload._M_value.val._M_dataplus._M_p);
        uVar15 = value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                 super__Optional_payload<UniValue,_true,_false,_false>.
                 super__Optional_payload_base<UniValue>._M_payload._M_value.val._M_string_length;
        uVar20 = value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                 super__Optional_payload<UniValue,_true,_false,_false>.
                 super__Optional_payload_base<UniValue>._M_payload._0_8_;
        if ((undefined1 *)
            value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
            super__Optional_payload<UniValue,_true,_false,_false>.
            super__Optional_payload_base<UniValue>._M_payload._0_8_ !=
            (undefined1 *)
            ((long)&value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                    super__Optional_payload<UniValue,_true,_false,_false>.
                    super__Optional_payload_base<UniValue>._M_payload + 0x10)) goto LAB_003ee242;
      }
      break;
    }
LAB_003ede9a:
    local_164 = local_164 + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)prefix._M_dataplus._M_p != &prefix.field_2) {
    operator_delete(prefix._M_dataplus._M_p,
                    CONCAT71(prefix.field_2._M_allocated_capacity._1_7_,
                             prefix.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)str._M_dataplus._M_p != &str.field_2) {
    operator_delete(str._M_dataplus._M_p,
                    CONCAT71(str.field_2._M_allocated_capacity._1_7_,str.field_2._M_local_buf[0]) +
                    1);
  }
  if ((uVar28 & 5) == 0) {
    bVar26 = false;
  }
  else {
    bVar26 = options.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             options.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (!bVar26) {
      this_02 = &(this->m_settings).ro_config;
      args = options.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      ppVar27 = options.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      do {
        local_e0[0] = local_d0;
        pcVar19 = (args->first)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_e0,pcVar19,pcVar19 + (args->first)._M_string_length);
        key._M_string_length = (size_type)ppVar27;
        key._M_dataplus._M_p = (pointer)error;
        key.field_2._M_allocated_capacity._0_4_ = (int)this_02;
        key.field_2._M_allocated_capacity._4_4_ = (int)((ulong)this_02 >> 0x20);
        key.field_2._8_4_ = in_stack_fffffffffffffe50;
        key.field_2._12_4_ = uVar21;
        InterpretKey((KeyInfo *)&str,key);
        if (local_e0[0] != local_d0) {
          operator_delete(local_e0[0],local_d0[0] + 1);
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value_1
                       ,'-',(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &str);
        oVar14 = GetArgFlags(this,(string *)&value_1);
        if ((undefined1 *)
            value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
            super__Optional_payload<UniValue,_true,_false,_false>.
            super__Optional_payload_base<UniValue>._M_payload._0_8_ !=
            (undefined1 *)
            ((long)&value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                    super__Optional_payload<UniValue,_true,_false,_false>.
                    super__Optional_payload_base<UniValue>._M_payload + 0x10)) {
          operator_delete((void *)value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                                  super__Optional_payload<UniValue,_true,_false,_false>.
                                  super__Optional_payload_base<UniValue>._M_payload._0_8_,
                          value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                          super__Optional_payload<UniValue,_true,_false,_false>.
                          super__Optional_payload_base<UniValue>._M_payload._M_value.val.
                          _M_string_length + 1);
        }
        bVar6 = IsConfSupported((KeyInfo *)&str,error);
        if (!bVar6) {
LAB_003ee4f7:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)str._M_dataplus._M_p != &str.field_2) {
            operator_delete(str._M_dataplus._M_p,
                            CONCAT71(str.field_2._M_allocated_capacity._1_7_,
                                     str.field_2._M_local_buf[0]) + 1);
          }
          break;
        }
        if (((ulong)oVar14.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) {
          if ((char)uVar21 == '\0') {
            tinyformat::format<std::__cxx11::string>
                      ((string *)&value_1,(tinyformat *)"Invalid configuration value %s",
                       (char *)args,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar17)
            ;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(error,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &value_1);
            if ((undefined1 *)
                value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                super__Optional_payload<UniValue,_true,_false,_false>.
                super__Optional_payload_base<UniValue>._M_payload._0_8_ !=
                (undefined1 *)
                ((long)&value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                        super__Optional_payload<UniValue,_true,_false,_false>.
                        super__Optional_payload_base<UniValue>._M_payload + 0x10)) {
              operator_delete((void *)value_1.super__Optional_base<UniValue,_false,_false>.
                                      _M_payload.
                                      super__Optional_payload<UniValue,_true,_false,_false>.
                                      super__Optional_payload_base<UniValue>._M_payload._0_8_,
                              value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
                              super__Optional_payload<UniValue,_true,_false,_false>.
                              super__Optional_payload_base<UniValue>._M_payload._M_value.val.
                              _M_string_length + 1);
            }
            goto LAB_003ee4f7;
          }
          logging_function._M_str = "ReadConfigStream";
          logging_function._M_len = 0x10;
          source_file._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/common/config.cpp"
          ;
          source_file._M_len = 0x61;
          pcVar17 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/common/config.cpp"
          ;
          LogPrintFormatInternal<std::__cxx11::string>
                    (logging_function,source_file,0x6f,ALL,Info,(ConstevalFormatString<1U>)0x4dc2a6,
                     &args->first);
        }
        else {
          pcVar17 = (char *)((ulong)oVar14.super__Optional_base<unsigned_int,_true,_true>._M_payload
                                    .super__Optional_payload_base<unsigned_int> & 0xffffffff);
          InterpretValue(&value_1,(KeyInfo *)&str,&args->second,
                         oVar14.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                         super__Optional_payload_base<unsigned_int>._M_payload,error);
          if (value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
              super__Optional_payload<UniValue,_true,_false,_false>.
              super__Optional_payload_base<UniValue>._M_engaged == false) goto LAB_003ee4f7;
          this_00 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>_>_>_>
                    ::operator[](this_02,&local_a0);
          this_01 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                    ::operator[](this_00,(key_type *)&str);
          std::vector<UniValue,_std::allocator<UniValue>_>::push_back
                    (this_01,(value_type *)&value_1);
          if (value_1.super__Optional_base<UniValue,_false,_false>._M_payload.
              super__Optional_payload<UniValue,_true,_false,_false>.
              super__Optional_payload_base<UniValue>._M_engaged == true) {
            ::wallet::_GLOBAL__N_1::std::_Optional_payload_base<UniValue>::_M_destroy
                      ((_Optional_payload_base<UniValue> *)&value_1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)str._M_dataplus._M_p != &str.field_2) {
          operator_delete(str._M_dataplus._M_p,
                          CONCAT71(str.field_2._M_allocated_capacity._1_7_,
                                   str.field_2._M_local_buf[0]) + 1);
        }
        args = args + 1;
        bVar26 = args == ppVar27;
      } while (!bVar26);
    }
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&options);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock2.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return bVar26;
  }
LAB_003ee873:
  __stack_chk_fail();
}

Assistant:

bool ArgsManager::ReadConfigStream(std::istream& stream, const std::string& filepath, std::string& error, bool ignore_invalid_keys)
{
    LOCK(cs_args);
    std::vector<std::pair<std::string, std::string>> options;
    if (!GetConfigOptions(stream, filepath, error, options, m_config_sections)) {
        return false;
    }
    for (const std::pair<std::string, std::string>& option : options) {
        KeyInfo key = InterpretKey(option.first);
        std::optional<unsigned int> flags = GetArgFlags('-' + key.name);
        if (!IsConfSupported(key, error)) return false;
        if (flags) {
            std::optional<common::SettingsValue> value = InterpretValue(key, &option.second, *flags, error);
            if (!value) {
                return false;
            }
            m_settings.ro_config[key.section][key.name].push_back(*value);
        } else {
            if (ignore_invalid_keys) {
                LogPrintf("Ignoring unknown configuration value %s\n", option.first);
            } else {
                error = strprintf("Invalid configuration value %s", option.first);
                return false;
            }
        }
    }
    return true;
}